

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  byte bVar1;
  bool bVar2;
  Curl_cwriter_phase phase;
  int iVar3;
  CURLcode CVar4;
  size_t sVar5;
  size_t max;
  CURLcode unaff_R12D;
  Curl_cwtype *ce;
  Curl_cwtype *pCVar6;
  Curl_cwtype **ppCVar7;
  byte *pbVar8;
  Curl_cwriter *writer;
  Curl_cwtype *local_58;
  Curl_cwriter *local_38;
  
  phase = (is_transfer == 0) + 1 + (uint)(is_transfer == 0);
LAB_005fc9fa:
  while (((ulong)(byte)*enclist < 0x2d &&
         ((0x100100000200U >> ((ulong)(byte)*enclist & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  sVar5 = 1;
  max = 0;
  pbVar8 = (byte *)enclist;
  do {
    bVar1 = *pbVar8;
    if (bVar1 < 0x20) {
      if (bVar1 != 9) {
        if (bVar1 != 0) goto LAB_005fca3a;
        break;
      }
    }
    else if (bVar1 != 0x20) {
      if (bVar1 == 0x2c) break;
LAB_005fca3a:
      if (3 < (byte)(bVar1 - 10)) {
        max = sVar5;
      }
    }
    pbVar8 = pbVar8 + 1;
    sVar5 = sVar5 + 1;
  } while( true );
  if (max == 0) {
    bVar2 = true;
    CVar4 = unaff_R12D;
    goto LAB_005fcc28;
  }
  if (is_transfer == 0) {
    bVar2 = false;
    CVar4 = CURLE_OK;
    if (((data->set).field_0x8be & 0x10) != 0) goto LAB_005fcc28;
  }
  else if (((data->set).field_0x8bc & 0x40) == 0) {
    bVar2 = false;
    CVar4 = CURLE_OK;
    if (max != 7) goto LAB_005fcc28;
    iVar3 = curl_strnequal(enclist,"chunked",7);
    if (iVar3 == 0) {
      bVar2 = false;
      CVar4 = CURLE_OK;
      goto LAB_005fcc28;
    }
  }
  sVar5 = Curl_cwriter_count(data,phase);
  if (sVar5 - 4 < 0xfffffffffffffffb) {
    bVar2 = false;
    Curl_failf(data,"Reject response due to more than %u content encodings",5);
    CVar4 = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    if (((is_transfer == 0) || (iVar3 = curl_strnequal(enclist,"chunked",max), iVar3 == 0)) ||
       (local_58 = &Curl_httpchunk_unencoder, "CONNECT responded chunked"[max + 0x12] != '\0')) {
      ppCVar7 = general_unencoders;
      pCVar6 = &identity_encoding;
      local_58 = &Curl_httpchunk_unencoder;
      do {
        ppCVar7 = ppCVar7 + 1;
        iVar3 = curl_strnequal(enclist,pCVar6->name,max);
        if (((iVar3 == 0) || (pCVar6->name[max] != '\0')) &&
           ((pCVar6->alias == (char *)0x0 ||
            ((iVar3 = curl_strnequal(enclist,pCVar6->alias,max), iVar3 == 0 ||
             (pCVar6->alias[max] != '\0')))))) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
          local_58 = pCVar6;
        }
        if (!bVar2) goto LAB_005fcbd6;
        pCVar6 = *ppCVar7;
      } while (pCVar6 != (Curl_cwtype *)0x0);
      local_58 = (Curl_cwtype *)0x0;
    }
LAB_005fcbd6:
    if (local_58 == (Curl_cwtype *)0x0) {
      local_58 = &error_writer;
    }
    CVar4 = Curl_cwriter_create(&local_38,data,local_58,phase);
    if (CVar4 == CURLE_OK) {
      CVar4 = Curl_cwriter_add(data,local_38);
      if (CVar4 == CURLE_OK) {
        bVar2 = true;
        CVar4 = unaff_R12D;
        goto LAB_005fcc28;
      }
      Curl_cwriter_free(data,local_38);
    }
    bVar2 = false;
  }
LAB_005fcc28:
  if (!bVar2) {
    return CVar4;
  }
  enclist = (char *)pbVar8;
  unaff_R12D = CVar4;
  if (*pbVar8 == 0) {
    return CURLE_OK;
  }
  goto LAB_005fc9fa;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer?
                             CURL_CW_TRANSFER_DECODE:CURL_CW_CONTENT_DECODE;
  CURLcode result;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding &&
          (namelen != 7 || !strncasecompare(name, "chunked", 7))) ||
         (!is_transfer && data->set.http_ce_skip)) {
        /* not requested, ignore */
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
    }
  } while(*enclist);

  return CURLE_OK;
}